

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

void gguf_set_kv(gguf_context *ctx,gguf_context *src)

{
  gguf_kv *this;
  gguf_type type;
  pointer pgVar1;
  char *pcVar2;
  long lVar3;
  size_t __n;
  uchar *puVar4;
  long lVar5;
  double *pdVar6;
  unsigned_long *puVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint *puVar10;
  char *pcVar11;
  int *piVar12;
  unsigned_short *puVar13;
  bool *pbVar14;
  short *psVar15;
  float *pfVar16;
  size_t sVar17;
  int line;
  long lVar18;
  bool bVar19;
  allocator_type local_49;
  vector<const_char_*,_std::allocator<const_char_*>_> tmp;
  
  lVar3 = ((long)(src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x58;
  lVar18 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar18;
  }
  do {
    if (lVar18 == lVar3) {
      return;
    }
    pgVar1 = (src->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    this = pgVar1 + lVar18;
    if (pgVar1[lVar18].is_array == false) {
      switch(this->type) {
      case GGUF_TYPE_UINT8:
        pcVar2 = (this->key)._M_dataplus._M_p;
        puVar4 = gguf_kv::get_val<unsigned_char>(this,0);
        gguf_set_val_u8(ctx,pcVar2,*puVar4);
        break;
      case GGUF_TYPE_INT8:
        pcVar2 = (this->key)._M_dataplus._M_p;
        pcVar11 = gguf_kv::get_val<signed_char>(this,0);
        gguf_set_val_i8(ctx,pcVar2,*pcVar11);
        break;
      case GGUF_TYPE_UINT16:
        pcVar2 = (this->key)._M_dataplus._M_p;
        puVar13 = gguf_kv::get_val<unsigned_short>(this,0);
        gguf_set_val_u16(ctx,pcVar2,*puVar13);
        break;
      case GGUF_TYPE_INT16:
        pcVar2 = (this->key)._M_dataplus._M_p;
        psVar15 = gguf_kv::get_val<short>(this,0);
        gguf_set_val_i16(ctx,pcVar2,*psVar15);
        break;
      case GGUF_TYPE_UINT32:
        pcVar2 = (this->key)._M_dataplus._M_p;
        puVar10 = gguf_kv::get_val<unsigned_int>(this,0);
        gguf_set_val_u32(ctx,pcVar2,*puVar10);
        break;
      case GGUF_TYPE_INT32:
        pcVar2 = (this->key)._M_dataplus._M_p;
        piVar12 = gguf_kv::get_val<int>(this,0);
        gguf_set_val_i32(ctx,pcVar2,*piVar12);
        break;
      case GGUF_TYPE_FLOAT32:
        pcVar2 = (this->key)._M_dataplus._M_p;
        pfVar16 = gguf_kv::get_val<float>(this,0);
        gguf_set_val_f32(ctx,pcVar2,*pfVar16);
        break;
      case GGUF_TYPE_BOOL:
        pcVar2 = (this->key)._M_dataplus._M_p;
        pbVar14 = gguf_kv::get_val<bool>(this,0);
        gguf_set_val_bool(ctx,pcVar2,*pbVar14);
        break;
      case GGUF_TYPE_STRING:
        pcVar2 = (this->key)._M_dataplus._M_p;
        pbVar9 = gguf_kv::get_val<std::__cxx11::string>(this,0);
        gguf_set_val_str(ctx,pcVar2,(pbVar9->_M_dataplus)._M_p);
        break;
      default:
        line = 0x422;
        goto LAB_00140a63;
      case GGUF_TYPE_UINT64:
        pcVar2 = (this->key)._M_dataplus._M_p;
        puVar7 = gguf_kv::get_val<unsigned_long>(this,0);
        gguf_set_val_u64(ctx,pcVar2,*puVar7);
        break;
      case GGUF_TYPE_INT64:
        pcVar2 = (this->key)._M_dataplus._M_p;
        plVar8 = gguf_kv::get_val<long>(this,0);
        gguf_set_val_i64(ctx,pcVar2,*plVar8);
        break;
      case GGUF_TYPE_FLOAT64:
        pcVar2 = (this->key)._M_dataplus._M_p;
        pdVar6 = gguf_kv::get_val<double>(this,0);
        gguf_set_val_f64(ctx,pcVar2,*pdVar6);
      }
    }
    else {
      __n = gguf_kv::get_ne(this);
      type = this->type;
      if (GGUF_TYPE_FLOAT64 < type) {
LAB_00140a50:
        line = 0x43f;
LAB_00140a63:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
                   ,line,"invalid type");
      }
      if ((0x1cffU >> (type & 0x1f) & 1) == 0) {
        if (type != GGUF_TYPE_STRING) goto LAB_00140a50;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&tmp,__n,&local_49);
        lVar5 = 0;
        sVar17 = __n;
        while (bVar19 = sVar17 != 0, sVar17 = sVar17 - 1, bVar19) {
          *(undefined8 *)
           ((long)tmp.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar5) =
               *(undefined8 *)
                ((long)&(((this->data_string).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5 * 4)
          ;
          lVar5 = lVar5 + 8;
        }
        gguf_set_arr_str(ctx,(this->key)._M_dataplus._M_p,
                         tmp.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                         .super__Vector_impl_data._M_start,__n);
        std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                  (&tmp.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      }
      else {
        gguf_set_arr_data(ctx,(this->key)._M_dataplus._M_p,type,
                          (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n);
      }
    }
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

void gguf_set_kv(struct gguf_context * ctx, const struct gguf_context * src) {
    const int64_t n_kv = gguf_get_n_kv(src);
    for (int64_t i = 0; i < n_kv; ++i) {
        const struct gguf_kv & kv = src->kv[i];

        if (!kv.is_array) {
            switch (kv.get_type()) {
                case GGUF_TYPE_UINT8:   gguf_set_val_u8  (ctx, kv.get_key().c_str(), kv.get_val<uint8_t>());             break;
                case GGUF_TYPE_INT8:    gguf_set_val_i8  (ctx, kv.get_key().c_str(), kv.get_val<int8_t>());              break;
                case GGUF_TYPE_UINT16:  gguf_set_val_u16 (ctx, kv.get_key().c_str(), kv.get_val<uint16_t>());            break;
                case GGUF_TYPE_INT16:   gguf_set_val_i16 (ctx, kv.get_key().c_str(), kv.get_val<int16_t>());             break;
                case GGUF_TYPE_UINT32:  gguf_set_val_u32 (ctx, kv.get_key().c_str(), kv.get_val<uint32_t>());            break;
                case GGUF_TYPE_INT32:   gguf_set_val_i32 (ctx, kv.get_key().c_str(), kv.get_val<int32_t>());             break;
                case GGUF_TYPE_FLOAT32: gguf_set_val_f32 (ctx, kv.get_key().c_str(), kv.get_val<float>());               break;
                case GGUF_TYPE_UINT64:  gguf_set_val_u64 (ctx, kv.get_key().c_str(), kv.get_val<uint64_t>());            break;
                case GGUF_TYPE_INT64:   gguf_set_val_i64 (ctx, kv.get_key().c_str(), kv.get_val<int64_t>());             break;
                case GGUF_TYPE_FLOAT64: gguf_set_val_f64 (ctx, kv.get_key().c_str(), kv.get_val<double>());              break;
                case GGUF_TYPE_BOOL:    gguf_set_val_bool(ctx, kv.get_key().c_str(), kv.get_val<bool>());                break;
                case GGUF_TYPE_STRING:  gguf_set_val_str (ctx, kv.get_key().c_str(), kv.get_val<std::string>().c_str()); break;
                case GGUF_TYPE_ARRAY:
                default: GGML_ABORT("invalid type");
            }
            continue;
        }

        const size_t ne = kv.get_ne();

        switch (kv.get_type()) {
            case GGUF_TYPE_UINT8:
            case GGUF_TYPE_INT8:
            case GGUF_TYPE_UINT16:
            case GGUF_TYPE_INT16:
            case GGUF_TYPE_UINT32:
            case GGUF_TYPE_INT32:
            case GGUF_TYPE_FLOAT32:
            case GGUF_TYPE_UINT64:
            case GGUF_TYPE_INT64:
            case GGUF_TYPE_FLOAT64:
            case GGUF_TYPE_BOOL: {
                gguf_set_arr_data(ctx, kv.get_key().c_str(), kv.get_type(), kv.data.data(), ne);
            } break;
            case GGUF_TYPE_STRING: {
                std::vector<const char *> tmp(ne);
                for (size_t j = 0; j < ne; ++j) {
                    tmp[j] = kv.data_string[j].c_str();
                }
                gguf_set_arr_str(ctx, kv.get_key().c_str(), tmp.data(), ne);
            } break;
            case GGUF_TYPE_ARRAY:
            default: GGML_ABORT("invalid type");
        }
    }
}